

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filteredbrk.cpp
# Opt level: O2

int32_t __thiscall
icu_63::SimpleFilteredSentenceBreakIterator::internalNext
          (SimpleFilteredSentenceBreakIterator *this,int32_t n)

{
  EFBMatchResult EVar1;
  int64_t iVar2;
  UErrorCode status;
  
  if (n != -1) {
    if ((this->fData->fBackwardsTrie).super_LocalPointerBase<icu_63::UCharsTrie>.ptr ==
        (UCharsTrie *)0x0) {
      return n;
    }
    status = U_ZERO_ERROR;
    resetState(this,&status);
    if (status < U_ILLEGAL_ARGUMENT_ERROR) {
      iVar2 = utext_nativeLength_63((this->fText).super_LocalPointerBase<UText>.ptr);
      while( true ) {
        if (n == -1) {
          return -1;
        }
        if (iVar2 == n) break;
        EVar1 = breakExceptionAt(this,n);
        if (EVar1 == kNoExceptionHere) {
          return n;
        }
        n = (*(((this->fDelegate).super_LocalPointerBase<icu_63::BreakIterator>.ptr)->super_UObject)
              ._vptr_UObject[0xd])();
      }
      return n;
    }
  }
  return -1;
}

Assistant:

int32_t
SimpleFilteredSentenceBreakIterator::internalNext(int32_t n) {
  if(n == UBRK_DONE || // at end  or
    fData->fBackwardsTrie.isNull()) { // .. no backwards table loaded == no exceptions
      return n;
  }
  // OK, do we need to break here?
  UErrorCode status = U_ZERO_ERROR;
  // refresh text
  resetState(status);
  if(U_FAILURE(status)) return UBRK_DONE; // bail out
  int64_t utextLen = utext_nativeLength(fText.getAlias());

  //if(debug2) u_printf("str, native len=%d\n", utext_nativeLength(fText.getAlias()));
  while (n != UBRK_DONE && n != utextLen) { // outer loop runs once per underlying break (from fDelegate).
    SimpleFilteredSentenceBreakIterator::EFBMatchResult m = breakExceptionAt(n);

    switch(m) {
    case kExceptionHere:
      n = fDelegate->next(); // skip this one. Find the next lowerlevel break.
      continue;

    default:
    case kNoExceptionHere:
      return n;
    }    
  }
  return n;
}